

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imsg-buffer.c
# Opt level: O1

int ibuf_add(ibuf *buf,void *data,size_t len)

{
  int iVar1;
  
  if ((buf->size < buf->wpos + len) && (iVar1 = ibuf_realloc(buf,len), iVar1 == -1)) {
    return -1;
  }
  memcpy(buf->buf + buf->wpos,data,len);
  buf->wpos = buf->wpos + len;
  return 0;
}

Assistant:

int
ibuf_add(struct ibuf *buf, const void *data, size_t len)
{
	if (buf->wpos + len > buf->size)
		if (ibuf_realloc(buf, len) == -1)
			return (-1);

	memcpy(buf->buf + buf->wpos, data, len);
	buf->wpos += len;
	return (0);
}